

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib504.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  timeval tVar8;
  timeval older;
  int ec_7;
  CURLMcode ec_6;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMsg *msg;
  undefined1 auStack_208 [4];
  int numleft;
  int local_1f8;
  int local_1f4;
  CURLMcode ec_5;
  int maxfd;
  timeval interval;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_1c0;
  int local_1b4;
  undefined1 local_1b0 [4];
  int running;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  CURLM *m;
  int res;
  CURL *c;
  char *URL_local;
  
  m._4_4_ = 0;
  rd.__fds_bits[0xf] = 0;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_1c0 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_1c0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                  ,0x2f,iVar2,uVar3);
    m._4_4_ = iVar2;
  }
  if (m._4_4_ != 0) {
    return m._4_4_;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                  ,0x31);
    m._4_4_ = 0x7c;
  }
  if (m._4_4_ == 0) {
    if (libtest_arg2 != (char *)0x0) {
      iVar2 = curl_easy_setopt(lVar4,0x2714,libtest_arg2);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                      ,0x36,iVar2,uVar3);
        m._4_4_ = iVar2;
      }
      if (m._4_4_ != 0) goto LAB_00102b4e;
    }
    iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar1 = _stderr;
    if (iVar2 != 0) {
      uVar3 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                    ,0x37,iVar2,uVar3);
      m._4_4_ = iVar2;
    }
    if (m._4_4_ == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x29,1);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                      ,0x38,iVar2,uVar3);
        m._4_4_ = iVar2;
      }
      if (m._4_4_ == 0) {
        rd.__fds_bits[0xf] = curl_multi_init();
        if (rd.__fds_bits[0xf] == 0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                        ,0x3a);
          m._4_4_ = 0x7b;
        }
        if (m._4_4_ == 0) {
          iVar2 = curl_multi_add_handle(rd.__fds_bits[0xf],lVar4);
          uVar1 = _stderr;
          interval.tv_usec._4_4_ = iVar2;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                          ,0x3c,iVar2,uVar3);
            m._4_4_ = interval.tv_usec._4_4_;
          }
          while (m._4_4_ == 0) {
            local_1f4 = -99;
            _ec_5 = 1;
            interval.tv_sec = 0;
            curl_mfprintf(_stderr,"curl_multi_perform()\n");
            iVar2 = curl_multi_perform(rd.__fds_bits[0xf],&local_1b4);
            uVar1 = _stderr;
            local_1f8 = iVar2;
            if (iVar2 == 0) {
              if (local_1b4 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                              ,0x47,local_1b4);
                m._4_4_ = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                            ,0x47,iVar2,uVar3);
              m._4_4_ = local_1f8;
            }
            if (m._4_4_ != 0) break;
            _auStack_208 = tutil_tvnow();
            tVar8.tv_usec = tv_test_start.tv_usec;
            tVar8.tv_sec = tv_test_start.tv_sec;
            lVar5 = tutil_tvdiff(_auStack_208,tVar8);
            if (60000 < lVar5) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                            ,0x49);
              m._4_4_ = 0x7d;
            }
            if (m._4_4_ != 0) break;
            if (local_1b4 == 0) {
              lVar5 = curl_multi_info_read(rd.__fds_bits[0xf],(long)&msg + 4);
              curl_mfprintf(_stderr,"Expected: not running\n");
              if ((lVar5 == 0) || (msg._4_4_ != 0)) {
                m._4_4_ = 0x77;
              }
              else {
                m._4_4_ = 0x78;
              }
              break;
            }
            curl_mfprintf(_stderr,"running == %d\n",local_1b4);
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              *(undefined8 *)(local_1b0 + (ulong)__arr_2._4_4_ * 8) = 0;
            }
            curl_mfprintf(_stderr,"curl_multi_fdset()\n");
            iVar2 = curl_multi_fdset(rd.__fds_bits[0xf],wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,
                                     local_1b0,&local_1f4);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (local_1f4 < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                              ,0x5e,local_1f4);
                m._4_4_ = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                            ,0x5e,iVar2,uVar3);
              m._4_4_ = iVar2;
            }
            if (m._4_4_ != 0) break;
            iVar2 = select_wrapper(local_1f4 + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                   (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)local_1b0,
                                   (timeval *)&ec_5);
            if (iVar2 == -1) {
              piVar6 = __errno_location();
              uVar1 = _stderr;
              iVar2 = *piVar6;
              pcVar7 = strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                            ,0x62,iVar2,pcVar7);
              m._4_4_ = 0x79;
            }
            if (m._4_4_ != 0) break;
            tVar8 = tutil_tvnow();
            older.tv_usec = tv_test_start.tv_usec;
            older.tv_sec = tv_test_start.tv_sec;
            lVar5 = tutil_tvdiff(tVar8,older);
            if (60000 < lVar5) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib504.c"
                            ,100);
              m._4_4_ = 0x7d;
            }
          }
        }
      }
    }
  }
LAB_00102b4e:
  curl_multi_remove_handle(rd.__fds_bits[0xf],lVar4);
  curl_multi_cleanup(rd.__fds_bits[0xf]);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return m._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  int res = 0;
  CURLM *m = NULL;
  fd_set rd, wr, exc;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  /* The point here is that there must not be anything running on the given
     proxy port */
  if(libtest_arg2)
    easy_setopt(c, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    fprintf(stderr, "curl_multi_perform()\n");

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      /* This is where this code is expected to reach */
      int numleft;
      CURLMsg *msg = curl_multi_info_read(m, &numleft);
      fprintf(stderr, "Expected: not running\n");
      if(msg && !numleft)
        res = TEST_ERR_SUCCESS; /* this is where we should be */
      else
        res = TEST_ERR_FAILURE; /* not correct */
      break; /* done */
    }
    fprintf(stderr, "running == %d\n", running);

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    fprintf(stderr, "curl_multi_fdset()\n");

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}